

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::sha256_testvectors::test_method(sha256_testvectors *this)

{
  long in_FS_OFFSET;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"e3b0c44298fc1c149afbf4c8996fb92427ae41e4649b934ca495991b7852b855",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"abc",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ba7816bf8f01cfea414140de5dae2223b00361a396177a9cb410ff61f20015ad",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"message digest",&local_51)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"f7846f55cf23e14eebeab5b4e1550cad5b509e3348fbc4efa3a1413d393cb650",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"secure hash algorithm",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"f30ceb2bb2829e79e4ca9753d35a8ecc00262d164cc077080295381cbd643f0d",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"SHA256 is considered to be safe",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"6819d915c73f4d1e77e4e1b52d1fa0f9cf9beaead3939f15874bd988e2a23630",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"248d6a61d20638b8e5c026930c3e6039a33ce45964ff2167f6ecedd419db06c1",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"For this sample, this 63-byte string will be used as input data",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"f08a78cbbaee082b052ae0708f32fa1e50c5c421aa772ba5dbb406a2ea6be342",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"This is exactly 64 bytes long, not counting the terminating byte",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ab64eff7e88e2e46165e29f2bce41826bd4c7b3552f6b382a9e7d3af47c245f8",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "As Bitcoin relies on 80 byte header hashes, we want to have an example for that.",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"7406e8de7d6e4fffc573daef05aefb8806e7790f55eab5576f31349743cca743",
             &local_52);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_30,1000000,'a');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"cdc76e5c9914fb9281a1c7e284d73e67f1809a48a497200e046d39ccc7112cd0",
             &local_51);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"a316d55510b49662420f49d145d42fb83f31ef8dc016aa4e32df049991a91e26",
             (allocator<char> *)&local_50);
  CryptoTest::TestSHA256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&test1_abi_cxx11_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sha256_testvectors) {
    TestSHA256("", "e3b0c44298fc1c149afbf4c8996fb92427ae41e4649b934ca495991b7852b855");
    TestSHA256("abc", "ba7816bf8f01cfea414140de5dae2223b00361a396177a9cb410ff61f20015ad");
    TestSHA256("message digest",
               "f7846f55cf23e14eebeab5b4e1550cad5b509e3348fbc4efa3a1413d393cb650");
    TestSHA256("secure hash algorithm",
               "f30ceb2bb2829e79e4ca9753d35a8ecc00262d164cc077080295381cbd643f0d");
    TestSHA256("SHA256 is considered to be safe",
               "6819d915c73f4d1e77e4e1b52d1fa0f9cf9beaead3939f15874bd988e2a23630");
    TestSHA256("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
               "248d6a61d20638b8e5c026930c3e6039a33ce45964ff2167f6ecedd419db06c1");
    TestSHA256("For this sample, this 63-byte string will be used as input data",
               "f08a78cbbaee082b052ae0708f32fa1e50c5c421aa772ba5dbb406a2ea6be342");
    TestSHA256("This is exactly 64 bytes long, not counting the terminating byte",
               "ab64eff7e88e2e46165e29f2bce41826bd4c7b3552f6b382a9e7d3af47c245f8");
    TestSHA256("As Bitcoin relies on 80 byte header hashes, we want to have an example for that.",
               "7406e8de7d6e4fffc573daef05aefb8806e7790f55eab5576f31349743cca743");
    TestSHA256(std::string(1000000, 'a'),
               "cdc76e5c9914fb9281a1c7e284d73e67f1809a48a497200e046d39ccc7112cd0");
    TestSHA256(test1, "a316d55510b49662420f49d145d42fb83f31ef8dc016aa4e32df049991a91e26");
}